

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_hook_sys_call.cpp
# Opt level: O0

rpchook_t * alloc_by_fd(int fd)

{
  rpchook_t *lp;
  rpchook_t *prStack_10;
  int fd_local;
  
  if ((fd < 0) || (999999 < fd)) {
    prStack_10 = (rpchook_t *)0x0;
  }
  else {
    prStack_10 = (rpchook_t *)calloc(1,0x38);
    (prStack_10->read_timeout).tv_sec = 0x28;
    (prStack_10->write_timeout).tv_sec = 10;
    g_rpchook_socket_fd[fd] = prStack_10;
  }
  return prStack_10;
}

Assistant:

static inline rpchook_t * alloc_by_fd( int fd )
{
	if( fd > -1 && fd < (int)sizeof(g_rpchook_socket_fd) / (int)sizeof(g_rpchook_socket_fd[0]) )
	{
		rpchook_t *lp = (rpchook_t*)calloc( 1,sizeof(rpchook_t) );
		lp->read_timeout.tv_sec = 40;
		lp->write_timeout.tv_sec = 10;
		g_rpchook_socket_fd[ fd ] = lp;
		return lp;
	}
	return NULL;
}